

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonpath::detail::
index_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::select(index_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  size_t sVar1;
  bool bVar2;
  int extraout_EAX;
  undefined7 extraout_var;
  size_t sVar3;
  size_t index;
  path_node_type *last;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current;
  undefined4 in_register_00000034;
  result_options in_stack_00000008;
  
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     __exceptfds);
  index = CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )__exceptfds);
    sVar1 = this->index_;
    index = sVar1;
    if ((-1 < (long)sVar1 && (long)sVar1 < (long)sVar3) ||
       (index = sVar3 + sVar1, (long)sVar1 < 0 && -1 < (long)index)) {
      last = path_generator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
             ::generate((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                         *)CONCAT44(in_register_00000034,__nfds),(path_node_type *)__writefds,index,
                        in_stack_00000008);
      current = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)__exceptfds,index);
      base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
      ::tail_select(&this->
                     super_base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                    ,(eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                      *)CONCAT44(in_register_00000034,__nfds),(reference)__readfds,last,current,
                    (node_receiver_type *)__timeout,in_stack_00000008);
      return extraout_EAX;
    }
  }
  return (int)index;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto slen = static_cast<int64_t>(current.size());
                if (index_ >= 0 && index_ < slen)
                {
                    auto i = static_cast<std::size_t>(index_);
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), receiver, options);
                }
                else 
                {
                    int64_t index = slen + index_;
                    if (index >= 0 && index < slen)
                    {
                        auto i = static_cast<std::size_t>(index);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, i, options), 
                                            current.at(i), receiver, options);
                    }
                }
            }
        }